

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_TreeCollider.cpp
# Opt level: O0

bool __thiscall Opcode::AABBTreeCollider::CheckTemporalCoherence(AABBTreeCollider *this,Pair *cache)

{
  Pair *cache_local;
  AABBTreeCollider *this_local;
  
  if (cache == (Pair *)0x0) {
    this_local._7_1_ = false;
  }
  else if (((((this->super_Collider).mFlags & 2) == 0) || (((this->super_Collider).mFlags & 1) == 0)
           ) || (PrimTest(this,cache->id0,cache->id1), ((this->super_Collider).mFlags & 4) == 0)) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool AABBTreeCollider::CheckTemporalCoherence(Pair* cache)
{
	// Checkings
	if(!cache)	return false;

	// Test previously colliding primitives first
	if(TemporalCoherenceEnabled() && FirstContactEnabled())
	{
		PrimTest(cache->id0, cache->id1);
		if(GetContactStatus())	return true;
	}
	return false;
}